

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

void stbiw__encode_png_line
               (uchar *pixels,int stride_bytes,int width,int height,int y,int n,int filter_type,
               char *line_buffer)

{
  uchar uVar1;
  byte bVar2;
  uchar uVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  int *piVar7;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  uchar *puVar12;
  byte *__src;
  long lVar13;
  
  piVar7 = stbiw__encode_png_line::mapping;
  if (y == 0) {
    piVar7 = stbiw__encode_png_line::firstmap;
  }
  iVar8 = ~y + height;
  if (stbi__flip_vertically_on_write == 0) {
    iVar8 = y;
  }
  lVar4 = (long)(iVar8 * stride_bytes);
  __src = pixels + lVar4;
  if (piVar7[filter_type] == 0) {
    memcpy(line_buffer,__src,(long)(n * width));
    return;
  }
  iVar8 = -stride_bytes;
  if (stbi__flip_vertically_on_write == 0) {
    iVar8 = stride_bytes;
  }
  lVar5 = (long)iVar8;
  uVar10 = 0;
  uVar11 = 0;
  if (0 < n) {
    uVar11 = (ulong)(uint)n;
  }
  iVar8 = piVar7[filter_type] + -1;
  do {
    if (uVar11 == uVar10) {
      switch(iVar8) {
      case 0:
        lVar5 = 0;
        for (lVar4 = (long)n; lVar4 < width * n; lVar4 = lVar4 + 1) {
          line_buffer[lVar4] = __src[lVar4] - __src[lVar5];
          lVar5 = lVar5 + 1;
        }
        break;
      case 1:
        lVar13 = (long)n;
        puVar12 = pixels + lVar4 + lVar13;
        pcVar9 = line_buffer + lVar13;
        for (; lVar13 < width * n; lVar13 = lVar13 + 1) {
          *pcVar9 = *puVar12 - puVar12[-lVar5];
          puVar12 = puVar12 + 1;
          pcVar9 = pcVar9 + 1;
        }
        break;
      case 2:
        lVar4 = (long)n;
        for (lVar13 = 0; lVar4 + lVar13 < (long)(width * n); lVar13 = lVar13 + 1) {
          line_buffer[lVar4] = __src[lVar4] - (char)((uint)__src[lVar4 - lVar5] + (uint)*__src >> 1)
          ;
          __src = __src + 1;
          line_buffer = line_buffer + 1;
        }
        break;
      case 3:
        lVar13 = (long)n;
        puVar12 = pixels + lVar4 + lVar13;
        for (; lVar13 < width * n; lVar13 = lVar13 + 1) {
          uVar1 = *puVar12;
          uVar3 = stbiw__paeth((uint)*__src,(uint)puVar12[-lVar5],(uint)__src[-lVar5]);
          line_buffer[lVar13] = uVar1 - uVar3;
          puVar12 = puVar12 + 1;
          __src = __src + 1;
        }
        break;
      case 4:
        lVar5 = 0;
        for (lVar4 = (long)n; lVar4 < width * n; lVar4 = lVar4 + 1) {
          line_buffer[lVar4] = __src[lVar4] - (__src[lVar5] >> 1);
          lVar5 = lVar5 + 1;
        }
        break;
      case 5:
        lVar5 = 0;
        for (lVar4 = (long)n; lVar4 < width * n; lVar4 = lVar4 + 1) {
          line_buffer[lVar4] = __src[lVar4] - __src[lVar5];
          lVar5 = lVar5 + 1;
        }
      }
      return;
    }
    switch(iVar8) {
    case 0:
    case 4:
    case 5:
      bVar6 = __src[uVar10];
      break;
    case 1:
      bVar6 = __src[uVar10] - __src[uVar10 - lVar5];
      break;
    case 2:
      bVar6 = __src[uVar10];
      bVar2 = __src[uVar10 - lVar5] >> 1;
      goto LAB_00175e97;
    case 3:
      bVar6 = __src[uVar10];
      bVar2 = stbiw__paeth(0,(uint)__src[uVar10 - lVar5],0);
LAB_00175e97:
      bVar6 = bVar6 - bVar2;
      break;
    default:
      goto switchD_00175e57_default;
    }
    line_buffer[uVar10] = bVar6;
switchD_00175e57_default:
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

static void stbiw__encode_png_line(unsigned char *pixels, int stride_bytes, int width, int height, int y, int n, int filter_type, signed char *line_buffer)
{
   static int mapping[] = { 0,1,2,3,4 };
   static int firstmap[] = { 0,1,0,5,6 };
   int *mymap = (y != 0) ? mapping : firstmap;
   int i;
   int type = mymap[filter_type];
   unsigned char *z = pixels + stride_bytes * (stbi__flip_vertically_on_write ? height-1-y : y);
   int signed_stride = stbi__flip_vertically_on_write ? -stride_bytes : stride_bytes;

   if (type==0) {
      memcpy(line_buffer, z, width*n);
      return;
   }

   // first loop isn't optimized since it's just one pixel
   for (i = 0; i < n; ++i) {
      switch (type) {
         case 1: line_buffer[i] = z[i]; break;
         case 2: line_buffer[i] = z[i] - z[i-signed_stride]; break;
         case 3: line_buffer[i] = z[i] - (z[i-signed_stride]>>1); break;
         case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-signed_stride],0)); break;
         case 5: line_buffer[i] = z[i]; break;
         case 6: line_buffer[i] = z[i]; break;
      }
   }
   switch (type) {
      case 1: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - z[i-n]; break;
      case 2: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - z[i-signed_stride]; break;
      case 3: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - ((z[i-n] + z[i-signed_stride])>>1); break;
      case 4: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-signed_stride], z[i-signed_stride-n]); break;
      case 5: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - (z[i-n]>>1); break;
      case 6: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
   }
}